

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int utfchar(lua_State *L)

{
  undefined1 local_2038 [8];
  luaL_Buffer b;
  int i;
  int n;
  lua_State *L_local;
  
  b.initb._8188_4_ = lua_gettop(L);
  if (b.initb._8188_4_ == 1) {
    pushutfchar(L,1);
  }
  else {
    luaL_buffinit(L,(luaL_Buffer *)local_2038);
    b.initb[0x1ff8] = '\x01';
    b.initb[0x1ff9] = '\0';
    b.initb[0x1ffa] = '\0';
    b.initb[0x1ffb] = '\0';
    for (; (int)b.initb._8184_4_ <= (int)b.initb._8188_4_; b.initb._8184_4_ = b.initb._8184_4_ + 1)
    {
      pushutfchar(L,b.initb._8184_4_);
      luaL_addvalue((luaL_Buffer *)local_2038);
    }
    luaL_pushresult((luaL_Buffer *)local_2038);
  }
  return 1;
}

Assistant:

static int utfchar(lua_State *L) {
    int n = lua_gettop(L);  /* number of arguments */
    if (n == 1)  /* optimize common case of single char */
        pushutfchar(L, 1);
    else {
        int i;
        luaL_Buffer b;
        luaL_buffinit(L, &b);
        for (i = 1; i <= n; i++) {
            pushutfchar(L, i);
            luaL_addvalue(&b);
        }
        luaL_pushresult(&b);
    }
    return 1;
}